

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

bool __thiscall spirv_cross::CompilerMSL::is_patch_block(CompilerMSL *this,SPIRType *type)

{
  ulong uVar1;
  bool bVar2;
  bool bVar3;
  ulong uVar4;
  
  bVar2 = Compiler::has_decoration
                    ((Compiler *)this,(ID)(type->super_IVariant).self.id,DecorationBlock);
  if (bVar2) {
    bVar2 = (type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
            buffer_size == 0;
    if ((!bVar2) &&
       (bVar3 = Compiler::has_member_decoration
                          ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,0,DecorationPatch
                          ), bVar3)) {
      uVar4 = 1;
      do {
        uVar1 = (type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
                buffer_size;
        bVar2 = uVar1 <= uVar4;
        if (uVar1 <= uVar4) {
          return bVar2;
        }
        bVar3 = Compiler::has_member_decoration
                          ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,(uint32_t)uVar4,
                           DecorationPatch);
        uVar4 = (ulong)((uint32_t)uVar4 + 1);
      } while (bVar3);
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool CompilerMSL::is_patch_block(const SPIRType &type)
{
	if (!has_decoration(type.self, DecorationBlock))
		return false;

	for (uint32_t i = 0; i < type.member_types.size(); i++)
	{
		if (!has_member_decoration(type.self, i, DecorationPatch))
			return false;
	}

	return true;
}